

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,asio::any_io_executor>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,endpoint_type *peer_endpoint,
          _Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
          *handler,any_io_executor *io_ex)

{
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
  *this_00;
  ptr local_50;
  endpoint *local_38;
  
  local_50.h = handler;
  local_38 = peer_endpoint;
  this_00 = reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
            ::ptr::allocate(handler);
  local_50.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  local_50.v = this_00;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
  ::reactive_socket_accept_op
            (this_00,&(this->super_reactive_socket_service_base).success_ec_,
             (impl->super_base_implementation_type).socket_,
             (impl->super_base_implementation_type).state_,peer,&impl->protocol_,local_38,handler,
             io_ex);
  local_50.p = this_00;
  reactive_socket_service_base::start_accept_op
            (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,
             (reactor_op *)this_00,false,
             (peer->impl_).implementation_.super_base_implementation_type.socket_ != -1);
  local_50.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  local_50.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_asio::any_io_executor>
  ::ptr::~ptr(&local_50);
  return;
}

Assistant:

void async_accept(implementation_type& impl, Socket& peer,
      endpoint_type* peer_endpoint, Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    typename associated_cancellation_slot<Handler>::type slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_accept_op<Socket, Protocol, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_, impl.state_,
        peer, impl.protocol_, peer_endpoint, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected() && !peer.is_open())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::read_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_accept"));

    start_accept_op(impl, p.p, is_continuation, peer.is_open());
    p.v = p.p = 0;
  }